

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  UnitTestImpl *pUVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  Test *this_00;
  OsStackTraceGetterInterface *pOVar4;
  undefined **ppuVar5;
  long lVar6;
  undefined1 local_50 [8];
  timeval now;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    pUVar1 = UnitTest::GetInstance::instance.impl_;
    (UnitTest::GetInstance::instance.impl_)->current_test_info_ = this;
    UnitTest::GetInstance();
    now.tv_usec = (__suseconds_t)((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(((TestEventRepeater *)now.tv_usec)->super_TestEventListener)._vptr_TestEventListener[7])();
    gettimeofday((timeval *)local_50,(__timezone_ptr_t)0x0);
    auVar2 = local_50;
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(now.tv_sec),8);
    if (pUVar1->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar4 = (OsStackTraceGetterInterface *)operator_new(8);
      ppuVar5 = &PTR__OsStackTraceGetterInterface_0019e698;
      pOVar4->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_0019e698;
      pUVar1->os_stack_trace_getter_ = pOVar4;
    }
    else {
      ppuVar5 = pUVar1->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
    }
    (*((_func_int **)ppuVar5)[3])();
    this_00 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (this->factory_,0x11,(char *)0x0);
    if (this_00 != (Test *)0x0) {
      bVar3 = Test::HasFatalFailure();
      if (!bVar3) {
        Test::Run(this_00);
      }
    }
    if (pUVar1->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar4 = (OsStackTraceGetterInterface *)operator_new(8);
      ppuVar5 = &PTR__OsStackTraceGetterInterface_0019e698;
      pOVar4->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_0019e698;
      pUVar1->os_stack_trace_getter_ = pOVar4;
    }
    else {
      ppuVar5 = pUVar1->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
    }
    (*((_func_int **)ppuVar5)[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this_00,0x17c76a,(char *)0x0);
    gettimeofday((timeval *)local_50,(__timezone_ptr_t)0x0);
    (this->result_).elapsed_time_ =
         ((long)local_50 - (long)auVar2) * 1000 +
         now.tv_sec / 1000 + ((lVar6 >> 7) - (lVar6 >> 0x3f));
    (**(code **)(*(long *)now.tv_usec + 0x48))(now.tv_usec,this);
    pUVar1->current_test_info_ = (TestInfo *)0x0;
  }
  return;
}

Assistant:

void TestInfo::Run() {
  if (!should_run_) return;

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TimeInMillis start = internal::GetTimeInMillis();

  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test only if the test object was created and its
  // constructor didn't generate a fatal failure.
  if ((test != NULL) && !Test::HasFatalFailure()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  // Deletes the test object.
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      test, &Test::DeleteSelf_, "the test fixture's destructor");

  result_.set_elapsed_time(internal::GetTimeInMillis() - start);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(NULL);
}